

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall llvm::raw_ostream::indent(raw_ostream *this,uint NumSpaces)

{
  size_t in_RCX;
  void *__buf;
  
  if (NumSpaces < 0x50) {
    write(this,0xe66de0,(void *)(ulong)NumSpaces,in_RCX);
  }
  else {
    do {
      __buf = (void *)0x4f;
      if (NumSpaces < 0x4f) {
        __buf = (void *)(ulong)NumSpaces;
      }
      write(this,0xe66de0,__buf,in_RCX);
      NumSpaces = NumSpaces - (int)__buf;
    } while (NumSpaces != 0);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::indent(unsigned NumSpaces) {
  return write_padding<' '>(*this, NumSpaces);
}